

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdInitializeFundRawTx
              (void *handle,int network_type,uint32_t target_asset_count,char *fee_asset,
              void **fund_handle)

{
  bool bVar1;
  int iVar2;
  char *__dest;
  undefined8 *puVar3;
  vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
  *this;
  CfdException *pCVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool is_bitcoin;
  allocator local_161;
  ConfidentialAssetId asset_data;
  undefined1 local_138 [32];
  string asset_hex;
  uint8_t empty_asset [33];
  CfdCapiFundRawTxData obj;
  
  cfd::Initialize();
  if (fund_handle == (void **)0x0) {
    obj.prefix._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x56;
    obj.prefix[8] = 'C';
    obj.prefix[9] = '\v';
    obj.prefix[10] = '\0';
    obj.prefix[0xb] = '\0';
    obj.net_type = 0x4fe785;
    obj.fee_asset[0] = '\0';
    obj.fee_asset[1] = '\0';
    obj.fee_asset[2] = '\0';
    obj.fee_asset[3] = '\0';
    cfd::core::logger::warn<>((CfdSourceLocation *)&obj,"fund handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&obj,"Failed to parameter. fund handle is null.",(allocator *)&asset_data);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&obj);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (target_asset_count == 0) {
    obj.prefix._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x56;
    obj.prefix[8] = 'I';
    obj.prefix[9] = '\v';
    obj.prefix[10] = '\0';
    obj.prefix[0xb] = '\0';
    obj.net_type = 0x4fe785;
    obj.fee_asset[0] = '\0';
    obj.fee_asset[1] = '\0';
    obj.fee_asset[2] = '\0';
    obj.fee_asset[3] = '\0';
    cfd::core::logger::warn<>((CfdSourceLocation *)&obj,"target_asset_count is zero.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&obj,"Failed to parameter. target_asset_count is null.",
               (allocator *)&asset_data);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&obj);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  memset(&obj,0,0x90);
  is_bitcoin = false;
  obj.net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
  bVar1 = cfd::capi::IsEmptyString(fee_asset);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&asset_hex,fee_asset,(allocator *)&asset_data);
    if (asset_hex._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset_data,&asset_hex);
      cfd::core::ConfidentialAssetId::GetData((ByteData *)local_138,&asset_data);
      cfd::core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)empty_asset,
                 (ByteData *)local_138);
      obj.fee_asset[0x20] = *(uint8_t *)(empty_asset._0_8_ + 0x20);
      obj.fee_asset._8_8_ = *(undefined8 *)(empty_asset._0_8_ + 8);
      obj.fee_asset._16_8_ = *(undefined8 *)(empty_asset._0_8_ + 0x10);
      obj.fee_asset._24_8_ = *(undefined8 *)(empty_asset._0_8_ + 0x18);
      obj.fee_asset._0_4_ = SUB84(*(undefined8 *)empty_asset._0_8_,0);
      obj.fee_asset._4_4_ = SUB84((ulong)*(undefined8 *)empty_asset._0_8_ >> 0x20,0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)empty_asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
      empty_asset[0x10] = '\0';
      empty_asset[0x11] = '\0';
      empty_asset[0x12] = '\0';
      empty_asset[0x13] = '\0';
      empty_asset[0x14] = '\0';
      empty_asset[0x15] = '\0';
      empty_asset[0x16] = '\0';
      empty_asset[0x17] = '\0';
      empty_asset[0x18] = '\0';
      empty_asset[0x19] = '\0';
      empty_asset[0x1a] = '\0';
      empty_asset[0x1b] = '\0';
      empty_asset[0x1c] = '\0';
      empty_asset[0x1d] = '\0';
      empty_asset[0x1e] = '\0';
      empty_asset[0x1f] = '\0';
      empty_asset[0] = '\0';
      empty_asset[1] = '\0';
      empty_asset[2] = '\0';
      empty_asset[3] = '\0';
      empty_asset[4] = '\0';
      empty_asset[5] = '\0';
      empty_asset[6] = '\0';
      empty_asset[7] = '\0';
      empty_asset[8] = '\0';
      empty_asset[9] = '\0';
      empty_asset[10] = '\0';
      empty_asset[0xb] = '\0';
      empty_asset[0xc] = '\0';
      empty_asset[0xd] = '\0';
      empty_asset[0xe] = '\0';
      empty_asset[0xf] = '\0';
      empty_asset[0x20] = '\0';
      iVar2 = bcmp(obj.fee_asset,empty_asset,0x21);
      if (iVar2 == 0) {
        bVar1 = false;
      }
      else {
        obj.is_elements = true;
        bVar1 = true;
        if (is_bitcoin == true) {
          local_138._0_8_ = "cfdcapi_transaction.cpp";
          local_138._8_4_ = 0xb5f;
          local_138._16_8_ = "CfdInitializeFundRawTx";
          cfd::core::logger::warn<>((CfdSourceLocation *)local_138,"network type is not elements.");
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)local_138,"Failed to parameter. network type is not elements.",
                     &local_161);
          cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_138)
          ;
          __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
      }
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset_data);
    }
    std::__cxx11::string::~string((string *)&asset_hex);
  }
  if (bVar1 != is_bitcoin) {
    obj.is_blind = false;
    if (bVar1 == false) {
      uVar5 = 0;
      uVar6 = 0x40340000;
    }
    else {
      uVar5 = 0x33333333;
      uVar6 = 0x3fc33333;
    }
    obj.long_term_fee_rate = (double)CONCAT44(uVar6,uVar5);
    obj.dust_fee_rate = 3.0;
    obj.knapsack_min_change = -1;
    obj.exponent = 0;
    obj.minimum_bits = 0x24;
    std::__cxx11::string::string((string *)&asset_data,"FundRawTxData",(allocator *)empty_asset);
    __dest = (char *)cfd::capi::AllocBuffer((string *)&asset_data,0x90);
    std::__cxx11::string::~string((string *)&asset_data);
    obj.prefix._0_8_ = *(undefined8 *)__dest;
    obj.prefix._8_8_ = *(undefined8 *)(__dest + 8);
    memcpy(__dest,&obj,0x90);
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    *(undefined8 **)(__dest + 0x38) = puVar3;
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    *(undefined8 **)(__dest + 0x40) = puVar3;
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    *(undefined8 **)(__dest + 0x48) = puVar3;
    this = (vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
            *)operator_new(0x18);
    std::
    vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
    ::vector(this,(ulong)target_asset_count,(allocator_type *)&asset_data);
    *(vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
      **)(__dest + 0x58) = this;
    puVar3 = (undefined8 *)operator_new(0x18);
    puVar3[2] = 0;
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined8 **)(__dest + 0x50) = puVar3;
    *fund_handle = __dest;
    return 0;
  }
  asset_data._vptr_ConfidentialAssetId = (_func_int **)0x4fe2f6;
  asset_data.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xb6b;
  asset_data.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdInitializeFundRawTx";
  cfd::core::logger::warn<>((CfdSourceLocation *)&asset_data,"network type not is bitcoin.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&asset_data,"Failed to parameter. network type is not bitcoin.",
             (allocator *)empty_asset);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&asset_data);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeFundRawTx(
    void* handle, int network_type, uint32_t target_asset_count,
    const char* fee_asset, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiFundRawTxData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }
    if (target_asset_count == 0) {
      warn(CFD_LOG_SOURCE, "target_asset_count is zero.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. target_asset_count is null.");
    }
    CfdCapiFundRawTxData obj;
    memset(&obj, 0, sizeof(obj));
    bool is_bitcoin = false;
    obj.net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!IsEmptyString(fee_asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      std::string asset_hex(fee_asset);
      if (!asset_hex.empty()) {
        ConfidentialAssetId asset_data(asset_hex);
        memcpy(
            obj.fee_asset, asset_data.GetData().GetBytes().data(),
            sizeof(obj.fee_asset));
        uint8_t empty_asset[kAssetSize];
        memset(empty_asset, 0, sizeof(empty_asset));
        if (memcmp(obj.fee_asset, empty_asset, sizeof(empty_asset)) != 0) {
          obj.is_elements = true;
          if (is_bitcoin) {
            warn(CFD_LOG_SOURCE, "network type is not elements.");
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Failed to parameter. network type is not elements.");
          }
        }
      }
#else
      info(CFD_LOG_SOURCE, "unuse asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (obj.is_elements == is_bitcoin) {
      warn(CFD_LOG_SOURCE, "network type not is bitcoin.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. network type is not bitcoin.");
    }
    obj.is_blind = false;
    obj.long_term_fee_rate = (obj.is_elements) ? 0.15 : 20.0;
    obj.dust_fee_rate = 3.0;
    obj.knapsack_min_change = -1;
    obj.exponent = 0;
    obj.minimum_bits = cfd::capi::kMinimumBits;  // = 36(old)

    buffer = static_cast<CfdCapiFundRawTxData*>(
        AllocBuffer(kPrefixFundRawTxData, sizeof(CfdCapiFundRawTxData)));
    memcpy(obj.prefix, buffer->prefix, sizeof(obj.prefix));
    *buffer = obj;
    buffer->utxos = new std::vector<UtxoData>();
    buffer->input_utxos = new std::vector<UtxoData>();
#ifndef CFD_DISABLE_ELEMENTS
    buffer->input_elements_utxos = new std::vector<ElementsUtxoAndOption>();
#endif  // CFD_DISABLE_ELEMENTS
    buffer->targets =
        new std::vector<CfdCapiFundTargetAmount>(target_asset_count);
    buffer->append_txout_addresses = new std::vector<std::string>();
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeFundRawTxHandle(handle, buffer);
  return result;
}